

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MapBind(duckdb *this,ClientContext *param_1,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *arguments)

{
  Expression EVar1;
  pointer puVar2;
  pointer puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  reference pvVar7;
  pointer pEVar8;
  undefined8 *puVar9;
  LogicalType *pLVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LogicalType value_type;
  LogicalType key_type;
  LogicalType local_e0;
  undefined1 local_df;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  LogicalType local_b8 [24];
  LogicalType local_a0 [24];
  LogicalType local_88 [24];
  LogicalType local_70 [24];
  LogicalType local_58 [24];
  LogicalType local_40 [24];
  
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)puVar2 - (long)puVar3 != 0x10 && puVar2 != puVar3) {
    duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
  }
  bVar11 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar11) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    EVar1 = pEVar8[0x38];
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    bVar11 = (pEVar8[0x38] == (Expression)0x1 || EVar1 == (Expression)0x1) || bVar11;
  }
  if (bVar11) {
    duckdb::LogicalType::LogicalType(local_40,SQLNULL);
    duckdb::LogicalType::LogicalType(local_58,SQLNULL);
    duckdb::LogicalType::MAP(&local_e0,local_40,local_58);
    uVar6 = uStack_d0;
    uVar5 = local_d8;
    bound_function->field_0x90 = local_e0;
    bound_function->field_0x91 = local_df;
    uVar12 = *(undefined4 *)&bound_function->field_0x98;
    uVar14 = *(undefined4 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = 0;
    *(undefined8 *)&bound_function->field_0xa0 = 0;
    local_d8 = 0;
    uStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = uVar5;
    *(undefined8 *)&bound_function->field_0xa0 = uVar6;
    uVar13 = *(undefined4 *)&bound_function->field_0x9c;
    uVar15 = *(undefined4 *)&bound_function->field_0xa4;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c8 = uVar12;
      uStack_c4 = *(undefined4 *)&bound_function->field_0x9c;
      uStack_c0 = uVar14;
      uStack_bc = *(undefined4 *)&bound_function->field_0xa4;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      uVar12 = local_c8;
      uVar13 = uStack_c4;
      uVar14 = uStack_c0;
      uVar15 = uStack_bc;
    }
    p_Var4 = uStack_d0;
    local_d8 = CONCAT44(uVar13,uVar12);
    uStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar15,uVar14);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    duckdb::LogicalType::~LogicalType(&local_e0);
    duckdb::LogicalType::~LogicalType(local_58);
    duckdb::LogicalType::~LogicalType(local_40);
    puVar9 = (undefined8 *)operator_new(0x20);
    duckdb::LogicalType::LogicalType(&local_e0,(LogicalType *)&bound_function->field_0x90);
    *puVar9 = &PTR__VariableReturnBindData_00898498;
    duckdb::LogicalType::LogicalType((LogicalType *)(puVar9 + 1),&local_e0);
    duckdb::LogicalType::~LogicalType(&local_e0);
    *(undefined8 **)this = puVar9;
  }
  else {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    if (pEVar8[0x38] != (Expression)0x65) {
      duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    if (pEVar8[0x38] != (Expression)0x65) {
      duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pLVar10 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar8 + 0x38));
    duckdb::LogicalType::LogicalType(local_70,pLVar10);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pLVar10 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar8 + 0x38));
    duckdb::LogicalType::LogicalType(local_88,pLVar10);
    duckdb::LogicalType::LogicalType(local_a0,local_70);
    duckdb::LogicalType::LogicalType(local_b8,local_88);
    duckdb::LogicalType::MAP(&local_e0,local_a0,local_b8);
    uVar6 = uStack_d0;
    uVar5 = local_d8;
    bound_function->field_0x90 = local_e0;
    bound_function->field_0x91 = local_df;
    uVar12 = *(undefined4 *)&bound_function->field_0x98;
    uVar14 = *(undefined4 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = 0;
    *(undefined8 *)&bound_function->field_0xa0 = 0;
    local_d8 = 0;
    uStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = uVar5;
    *(undefined8 *)&bound_function->field_0xa0 = uVar6;
    uVar13 = *(undefined4 *)&bound_function->field_0x9c;
    uVar15 = *(undefined4 *)&bound_function->field_0xa4;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c8 = uVar12;
      uStack_c4 = *(undefined4 *)&bound_function->field_0x9c;
      uStack_c0 = uVar14;
      uStack_bc = *(undefined4 *)&bound_function->field_0xa4;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      uVar12 = local_c8;
      uVar13 = uStack_c4;
      uVar14 = uStack_c0;
      uVar15 = uStack_bc;
    }
    p_Var4 = uStack_d0;
    local_d8 = CONCAT44(uVar13,uVar12);
    uStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar15,uVar14);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    duckdb::LogicalType::~LogicalType(&local_e0);
    duckdb::LogicalType::~LogicalType(local_b8);
    duckdb::LogicalType::~LogicalType(local_a0);
    puVar9 = (undefined8 *)operator_new(0x20);
    duckdb::LogicalType::LogicalType(&local_e0,(LogicalType *)&bound_function->field_0x90);
    *puVar9 = &PTR__VariableReturnBindData_00898498;
    duckdb::LogicalType::LogicalType((LogicalType *)(puVar9 + 1),&local_e0);
    duckdb::LogicalType::~LogicalType(&local_e0);
    *(undefined8 **)this = puVar9;
    duckdb::LogicalType::~LogicalType(local_88);
    duckdb::LogicalType::~LogicalType(local_70);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> MapBind(ClientContext &, ScalarFunction &bound_function,
                                        vector<unique_ptr<Expression>> &arguments) {

	if (arguments.size() != 2 && !arguments.empty()) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}

	bool is_null = false;
	if (arguments.empty()) {
		is_null = true;
	}
	if (!is_null) {
		auto key_id = arguments[0]->return_type.id();
		auto value_id = arguments[1]->return_type.id();
		if (key_id == LogicalTypeId::SQLNULL || value_id == LogicalTypeId::SQLNULL) {
			is_null = true;
		}
	}

	if (is_null) {
		bound_function.return_type = LogicalType::MAP(LogicalTypeId::SQLNULL, LogicalTypeId::SQLNULL);
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// bind a MAP with key-value pairs
	D_ASSERT(arguments.size() == 2);
	if (arguments[0]->return_type.id() != LogicalTypeId::LIST) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}
	if (arguments[1]->return_type.id() != LogicalTypeId::LIST) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}

	auto key_type = ListType::GetChildType(arguments[0]->return_type);
	auto value_type = ListType::GetChildType(arguments[1]->return_type);

	bound_function.return_type = LogicalType::MAP(key_type, value_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}